

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall
wasm::Literal::shuffleV8x16
          (Literal *__return_storage_ptr__,Literal *this,Literal *other,
          array<unsigned_char,_16UL> *mask)

{
  size_t i;
  long lVar1;
  ulong uVar2;
  uint8_t *puVar3;
  uint8_t local_28 [8];
  uint8_t bytes [16];
  
  if ((this->type).id == 6) {
    lVar1 = 0;
    do {
      uVar2 = (ulong)mask->_M_elems[lVar1];
      puVar3 = (uint8_t *)((uVar2 - 0x10) + (long)other);
      if (uVar2 < 0x10) {
        puVar3 = (this->field_0).v128 + uVar2;
      }
      local_28[lVar1] = *puVar3;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    Literal(__return_storage_ptr__,local_28);
    return __return_storage_ptr__;
  }
  __assert_fail("type == Type::v128",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                ,0x679,
                "Literal wasm::Literal::shuffleV8x16(const Literal &, const std::array<uint8_t, 16> &) const"
               );
}

Assistant:

Literal Literal::shuffleV8x16(const Literal& other,
                              const std::array<uint8_t, 16>& mask) const {
  assert(type == Type::v128);
  uint8_t bytes[16];
  for (size_t i = 0; i < mask.size(); ++i) {
    bytes[i] = (mask[i] < 16) ? v128[mask[i]] : other.v128[mask[i] - 16];
  }
  return Literal(bytes);
}